

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O2

void pztopology::TPZPyramid::AdjustTopDirections<double>
               (int ConstrainedFace,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  double *pdVar1;
  int i;
  long lVar2;
  int i_1;
  double dVar3;
  double dVar4;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> ar12;
  TPZManVector<double,_3> ar11;
  TPZManVector<double,_3> ar10;
  TPZManVector<double,_3> ar9;
  TPZManVector<double,_3> v3;
  
  dVar3 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&v1,3);
  TPZManVector<double,_3>::TPZManVector(&v2,3);
  TPZManVector<double,_3>::TPZManVector(&v3,3);
  TPZManVector<double,_3>::TPZManVector(&ar9,3);
  TPZManVector<double,_3>::TPZManVector(&ar10,3);
  TPZManVector<double,_3>::TPZManVector(&ar11,3);
  TPZManVector<double,_3>::TPZManVector(&ar12,3);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1 = TPZFMatrix<double>::operator()(gradx,lVar2,0);
    v1.super_TPZVec<double>.fStore[lVar2] = *pdVar1;
    pdVar1 = TPZFMatrix<double>::operator()(gradx,lVar2,1);
    v2.super_TPZVec<double>.fStore[lVar2] = *pdVar1;
    pdVar1 = TPZFMatrix<double>::operator()(gradx,lVar2,2);
    v3.super_TPZVec<double>.fStore[lVar2] = *pdVar1;
  }
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
    *(double *)((long)v1.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)v1.super_TPZVec<double>.fStore + lVar2) / dVar3;
    *(double *)((long)v2.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)v2.super_TPZVec<double>.fStore + lVar2) / dVar3;
    dVar4 = *(double *)((long)v3.super_TPZVec<double>.fStore + lVar2) / dVar3;
    *(double *)((long)v3.super_TPZVec<double>.fStore + lVar2) = dVar4;
    *(double *)((long)ar9.super_TPZVec<double>.fStore + lVar2) =
         dVar4 - (-*(double *)((long)v1.super_TPZVec<double>.fStore + lVar2) -
                 *(double *)((long)v2.super_TPZVec<double>.fStore + lVar2));
    *(double *)((long)ar10.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)v3.super_TPZVec<double>.fStore + lVar2) -
         (*(double *)((long)v1.super_TPZVec<double>.fStore + lVar2) -
         *(double *)((long)v2.super_TPZVec<double>.fStore + lVar2));
    *(double *)((long)ar11.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)v3.super_TPZVec<double>.fStore + lVar2) -
         (*(double *)((long)v1.super_TPZVec<double>.fStore + lVar2) +
         *(double *)((long)v2.super_TPZVec<double>.fStore + lVar2));
    *(double *)((long)ar12.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)v3.super_TPZVec<double>.fStore + lVar2) -
         (*(double *)((long)v2.super_TPZVec<double>.fStore + lVar2) -
         *(double *)((long)v1.super_TPZVec<double>.fStore + lVar2));
  }
  switch(ConstrainedFace) {
  case 1:
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0xb);
      *pdVar1 = 0.0;
      dVar3 = ar12.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x12);
      *pdVar1 = dVar3 * 0.25;
      dVar3 = v2.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x19);
      *pdVar1 = dVar3 * 0.5;
      dVar3 = ar11.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x20);
      *pdVar1 = dVar3 * 0.25;
    }
    break;
  case 2:
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar3 = ar12.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0xb);
      *pdVar1 = dVar3 * 0.25;
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x12);
      *pdVar1 = 0.0;
      dVar3 = ar9.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x19);
      *pdVar1 = dVar3 * 0.25;
      dVar3 = v1.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x20);
      *pdVar1 = dVar3 * -0.5;
    }
    break;
  case 3:
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar3 = v2.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0xb);
      *pdVar1 = dVar3 * -0.5;
      dVar3 = ar9.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x12);
      *pdVar1 = dVar3 * 0.25;
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x19);
      *pdVar1 = 0.0;
      dVar3 = ar10.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x20);
      *pdVar1 = dVar3 * 0.25;
    }
    break;
  case 4:
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar3 = ar11.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0xb);
      *pdVar1 = dVar3 * 0.25;
      dVar3 = v1.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x12);
      *pdVar1 = dVar3 * 0.5;
      dVar3 = ar10.super_TPZVec<double>.fStore[lVar2];
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x19);
      *pdVar1 = dVar3 * 0.25;
      pdVar1 = TPZFMatrix<double>::operator()(directions,lVar2,0x20);
      *pdVar1 = 0.0;
    }
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
               ,0x6d1);
  }
  TPZManVector<double,_3>::~TPZManVector(&ar12);
  TPZManVector<double,_3>::~TPZManVector(&ar11);
  TPZManVector<double,_3>::~TPZManVector(&ar10);
  TPZManVector<double,_3>::~TPZManVector(&ar9);
  TPZManVector<double,_3>::~TPZManVector(&v3);
  TPZManVector<double,_3>::~TPZManVector(&v2);
  TPZManVector<double,_3>::~TPZManVector(&v1);
  return;
}

Assistant:

void TPZPyramid::AdjustTopDirections(int ConstrainedFace,TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
#ifdef PZDEBUG
        if (directions.Cols() != 58 || ConstrainedFace < 1 || ConstrainedFace > 4) {
            DebugStop();
        }
#endif
        int vectors[] = {11,18,25,32};
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),ar9(3),ar10(3),ar11(3),ar12(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
        }
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
            ar9[i] = v3[i]-(-v1[i]-v2[i]);
            ar10[i] = v3[i]-(v1[i]-v2[i]);
            ar11[i] = v3[i]-(v1[i]+v2[i]);
            ar12[i] = v3[i]-(v2[i]-v1[i]);
        }

        switch (ConstrainedFace) {
            case 1:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = 0.;
                    directions(i,vectors[1]) = ar12[i]/4.;
                    directions(i,vectors[2]) = v2[i]/2.;
                    directions(i,vectors[3]) = ar11[i]/4.;
                }
                break;
            case 2:

                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = ar12[i]/4.;
                    directions(i,vectors[1]) = 0.;
                    directions(i,vectors[2]) = ar9[i]/4.;
                    directions(i,vectors[3]) = -v1[i]/2.;
                }
                    
                break;
            case 3:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = -v2[i]/2.;
                    directions(i,vectors[1]) = ar9[i]/4.;
                    directions(i,vectors[2]) = 0.;
                    directions(i,vectors[3]) = ar10[i]/4.;
                }
                break;
            case 4:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = ar11[i]/4.;
                    directions(i,vectors[1]) = v1[i]/2.;
                    directions(i,vectors[2]) = ar10[i]/4.;
                    directions(i,vectors[3]) = 0.;
                }
                break;
                
            default:
                DebugStop();
                break;
        }
    }